

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O1

string_view trim(string_view s)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  size_t sVar4;
  long in_RSI;
  ulong in_RDI;
  ulong uVar5;
  string_view sVar6;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  uVar3 = 0xffffffffffffffff;
  if (in_RDI != 0) {
    uVar5 = 0;
    do {
      pvVar1 = memchr(" \t\r\v\n",(int)*(char *)(in_RSI + uVar5),5);
      uVar3 = uVar5;
      if (pvVar1 == (void *)0x0) break;
      uVar5 = uVar5 + 1;
      uVar3 = 0xffffffffffffffff;
    } while (in_RDI != uVar5);
  }
  if (in_RDI <= uVar3) {
    uVar3 = in_RDI;
  }
  local_38._M_str = (char *)(in_RSI + uVar3);
  local_38._M_len = in_RDI - uVar3;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    (&local_38," \t\r\v\n",0xffffffffffffffff,5);
  uVar3 = ~sVar2 + (in_RDI - uVar3);
  sVar4 = 0;
  if (uVar3 <= local_38._M_len) {
    sVar4 = local_38._M_len - uVar3;
  }
  sVar6._M_str = local_38._M_str;
  sVar6._M_len = sVar4;
  return sVar6;
}

Assistant:

string_view trim(string_view s)
{
	s.remove_prefix(min(s.find_first_not_of(" \t\r\v\n"), s.size()));
	s.remove_suffix(min(s.size() - s.find_last_not_of(" \t\r\v\n") - 1, s.size()));
	return s;
}